

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElabVisitors.h
# Opt level: O0

void __thiscall
slang::ast::DiagnosticVisitor::handle(DiagnosticVisitor *this,InterfacePortSymbol *symbol)

{
  bool bVar1;
  DefinitionSymbol **__y;
  type *__y_00;
  SmallVectorBase<std::pair<const_slang::ast::InterfacePortSymbol_*,_const_slang::ast::ModportSymbol_*>_>
  *this_00;
  table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::DefinitionSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::DefinitionSymbol_*,_void>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
  *ptVar2;
  InterfacePortSymbol *in_RSI;
  long in_RDI;
  MethodPrototypeSymbol *method;
  specific_symbol_iterator<slang::ast::MethodPrototypeSymbol> __end5;
  specific_symbol_iterator<slang::ast::MethodPrototypeSymbol> __begin5;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::MethodPrototypeSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::MethodPrototypeSymbol>,_(std::ranges::subrange_kind)0>
  *__range5;
  type *modport;
  type *_;
  locator loc;
  size_t pos0;
  size_t hash;
  DefinitionSymbol **k;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  pair<const_slang::ast::InterfacePortSymbol_*,_const_slang::ast::ModportSymbol_*>
  *in_stack_fffffffffffffdd8;
  InterfacePortSymbol *in_stack_fffffffffffffde0;
  DiagnosticVisitor *in_stack_fffffffffffffde8;
  Scope *in_stack_fffffffffffffdf0;
  DefinitionSymbol **in_stack_fffffffffffffdf8;
  table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::DefinitionSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::DefinitionSymbol_*,_void>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
  *this_01;
  InterfacePortSymbol *local_1e8;
  pair<const_slang::ast::InterfacePortSymbol_*,_const_slang::ast::ModportSymbol_*> local_1e0;
  bitmask<slang::ast::MethodFlags> local_1ca;
  MethodPrototypeSymbol *local_1c8;
  DefinitionSymbol **in_stack_fffffffffffffe40;
  size_t in_stack_fffffffffffffe48;
  specific_symbol_iterator<slang::ast::MethodPrototypeSymbol> this_02;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::MethodPrototypeSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::MethodPrototypeSymbol>,_(std::ranges::subrange_kind)0>
  in_stack_fffffffffffffe50;
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::ast::DefinitionSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
  local_178 [2];
  InterfacePortSymbol *local_148;
  DefinitionSymbol **local_138;
  table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::DefinitionSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::DefinitionSymbol_*,_void>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
  *local_130;
  DefinitionSymbol **local_128;
  table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::DefinitionSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::DefinitionSymbol_*,_void>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
  *local_120;
  bool local_111 [25];
  iterator local_f8;
  bool local_e1 [17];
  InterfacePortSymbol *in_stack_ffffffffffffff30;
  iterator local_c8;
  bool local_b1;
  iterator local_b0;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_const_slang::ast::DefinitionSymbol_*>
  local_a0;
  size_t local_88;
  size_t local_80;
  DefinitionSymbol **local_78;
  DefinitionSymbol **local_70;
  table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::DefinitionSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::DefinitionSymbol_*,_void>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
  *local_68;
  uint local_5c;
  value_type *local_58;
  value_type *local_50;
  uint local_44;
  group_type *local_40;
  size_t local_38;
  pow2_quadratic_prober local_30;
  size_t local_20;
  size_t local_18;
  DefinitionSymbol **local_10;
  table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::DefinitionSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::DefinitionSymbol_*,_void>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
  *local_8;
  
  local_148 = in_RSI;
  bVar1 = handleDefault<slang::ast::InterfacePortSymbol>
                    (in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
  if ((bVar1) &&
     (InterfacePortSymbol::getDeclaredRange(in_stack_ffffffffffffff30),
     local_148->interfaceDef != (DefinitionSymbol *)0x0)) {
    ptVar2 = (table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::DefinitionSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::DefinitionSymbol_*,_void>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
              *)(in_RDI + 0x78);
    local_138 = &local_148->interfaceDef;
    local_130 = ptVar2;
    local_128 = local_138;
    local_120 = ptVar2;
    local_70 = local_138;
    local_68 = ptVar2;
    local_78 = boost::unordered::detail::foa::
               table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::DefinitionSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::DefinitionSymbol_const*,void>,std::equal_to<slang::ast::DefinitionSymbol_const*>,std::allocator<slang::ast::DefinitionSymbol_const*>>
               ::key_from<slang::ast::DefinitionSymbol_const*>((DefinitionSymbol **)0x8019a1);
    local_80 = boost::unordered::detail::foa::
               table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::DefinitionSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::DefinitionSymbol_const*,void>,std::equal_to<slang::ast::DefinitionSymbol_const*>,std::allocator<slang::ast::DefinitionSymbol_const*>>
               ::hash_for<slang::ast::DefinitionSymbol_const*>
                         ((table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::DefinitionSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::DefinitionSymbol_*,_void>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
                           *)in_stack_fffffffffffffde0,
                          (DefinitionSymbol **)in_stack_fffffffffffffdd8);
    local_88 = boost::unordered::detail::foa::
               table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::DefinitionSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::DefinitionSymbol_*,_void>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
               ::position_for((table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::DefinitionSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::DefinitionSymbol_*,_void>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
                               *)in_stack_fffffffffffffde0,(size_t)in_stack_fffffffffffffdd8);
    local_10 = local_78;
    local_20 = local_80;
    this_01 = ptVar2;
    local_18 = local_88;
    local_8 = ptVar2;
    boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober(&local_30,local_88);
    do {
      local_38 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_30);
      local_40 = boost::unordered::detail::foa::
                 table_arrays<const_slang::ast::DefinitionSymbol_*,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
                 ::groups((table_arrays<const_slang::ast::DefinitionSymbol_*,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
                           *)0x801a5b);
      local_40 = local_40 + local_38;
      local_44 = boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::match
                           ((group15<boost::unordered::detail::foa::plain_integral> *)
                            in_stack_fffffffffffffde8,(size_t)in_stack_fffffffffffffde0);
      if (local_44 != 0) {
        local_50 = boost::unordered::detail::foa::
                   table_arrays<const_slang::ast::DefinitionSymbol_*,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
                   ::elements((table_arrays<const_slang::ast::DefinitionSymbol_*,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
                               *)0x801aa6);
        local_58 = local_50 + local_38 * 0xf;
        do {
          local_5c = boost::unordered::detail::foa::unchecked_countr_zero(0);
          in_stack_fffffffffffffdf0 =
               (Scope *)boost::unordered::detail::foa::
                        table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::DefinitionSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::DefinitionSymbol_*,_void>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
                        ::pred((table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::DefinitionSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::DefinitionSymbol_*,_void>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
                                *)0x801af6);
          in_stack_fffffffffffffdf8 = local_10;
          __y = boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::DefinitionSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::DefinitionSymbol_const*,void>,std::equal_to<slang::ast::DefinitionSymbol_const*>,std::allocator<slang::ast::DefinitionSymbol_const*>>
                ::key_from<slang::ast::DefinitionSymbol_const*>((DefinitionSymbol **)0x801b23);
          bVar1 = std::equal_to<const_slang::ast::DefinitionSymbol_*>::operator()
                            ((equal_to<const_slang::ast::DefinitionSymbol_*> *)
                             in_stack_fffffffffffffdf0,in_stack_fffffffffffffdf8,__y);
          this_02 = in_stack_fffffffffffffe50._M_begin.current;
          if (bVar1) {
            boost::unordered::detail::foa::
            table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_const_slang::ast::DefinitionSymbol_*>
            ::table_locator(&local_a0,local_40,local_5c,local_58 + local_5c);
            goto LAB_00801c17;
          }
          local_44 = local_44 - 1 & local_44;
        } while (local_44 != 0);
      }
      bVar1 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                                  in_stack_fffffffffffffde0,(size_t)in_stack_fffffffffffffdd8);
      this_02 = in_stack_fffffffffffffe50._M_begin.current;
      if (bVar1) {
        memset(&local_a0,0,0x18);
        boost::unordered::detail::foa::
        table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_const_slang::ast::DefinitionSymbol_*>
        ::table_locator(&local_a0);
        goto LAB_00801c17;
      }
      bVar1 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                        (&local_30,(ptVar2->arrays).groups_size_mask);
      this_02 = in_stack_fffffffffffffe50._M_begin.current;
    } while (bVar1);
    memset(&local_a0,0,0x18);
    boost::unordered::detail::foa::
    table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_const_slang::ast::DefinitionSymbol_*>
    ::table_locator(&local_a0);
LAB_00801c17:
    bVar1 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                      ((table_locator *)&local_a0);
    if (bVar1) {
      local_b0 = boost::unordered::detail::foa::
                 table<boost::unordered::detail::foa::flat_set_types<const_slang::ast::DefinitionSymbol_*>,_slang::hash<const_slang::ast::DefinitionSymbol_*,_void>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
                 ::make_iterator((locator *)0x801c37);
      local_b1 = false;
      std::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::ast::DefinitionSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
      ::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::ast::DefinitionSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                (local_178,&local_b0,&local_b1);
    }
    else if ((this_01->size_ctrl).size < (this_01->size_ctrl).ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::DefinitionSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::DefinitionSymbol_const*,void>,std::equal_to<slang::ast::DefinitionSymbol_const*>,std::allocator<slang::ast::DefinitionSymbol_const*>>
      ::unchecked_emplace_at<slang::ast::DefinitionSymbol_const*const&>
                (this_01,(size_t)in_stack_fffffffffffffdf8,(size_t)in_stack_fffffffffffffdf0,
                 (DefinitionSymbol **)in_stack_fffffffffffffde8);
      local_c8 = boost::unordered::detail::foa::
                 table<boost::unordered::detail::foa::flat_set_types<const_slang::ast::DefinitionSymbol_*>,_slang::hash<const_slang::ast::DefinitionSymbol_*,_void>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
                 ::make_iterator((locator *)0x801cb7);
      local_e1[0] = true;
      std::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::ast::DefinitionSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
      ::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::ast::DefinitionSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                (local_178,&local_c8,local_e1);
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<slang::ast::DefinitionSymbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::DefinitionSymbol_const*,void>,std::equal_to<slang::ast::DefinitionSymbol_const*>,std::allocator<slang::ast::DefinitionSymbol_const*>>
      ::unchecked_emplace_with_rehash<slang::ast::DefinitionSymbol_const*const&>
                ((table_core<boost::unordered::detail::foa::flat_set_types<const_slang::ast::DefinitionSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::DefinitionSymbol_*,_void>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
                  *)this_02.current,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
      local_f8 = boost::unordered::detail::foa::
                 table<boost::unordered::detail::foa::flat_set_types<const_slang::ast::DefinitionSymbol_*>,_slang::hash<const_slang::ast::DefinitionSymbol_*,_void>,_std::equal_to<const_slang::ast::DefinitionSymbol_*>,_std::allocator<const_slang::ast::DefinitionSymbol_*>_>
                 ::make_iterator((locator *)0x801d1d);
      local_111[0] = true;
      std::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::ast::DefinitionSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
      ::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::ast::DefinitionSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                (local_178,&local_f8,local_111);
    }
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_148->modport);
    if (!bVar1) {
      InterfacePortSymbol::getConnection((InterfacePortSymbol *)in_stack_fffffffffffffde8);
      std::get<0ul,slang::ast::Symbol_const*,slang::ast::ModportSymbol_const*>
                ((pair<const_slang::ast::Symbol_*,_const_slang::ast::ModportSymbol_*> *)0x801d95);
      __y_00 = std::get<1ul,slang::ast::Symbol_const*,slang::ast::ModportSymbol_const*>
                         ((pair<const_slang::ast::Symbol_*,_const_slang::ast::ModportSymbol_*> *)
                          0x801daa);
      if (*__y_00 != (type)0x0) {
        Scope::membersOfType<slang::ast::MethodPrototypeSymbol>(in_stack_fffffffffffffdf0);
        std::ranges::
        subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::MethodPrototypeSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::MethodPrototypeSymbol>,_(std::ranges::subrange_kind)0>
        ::begin((subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::MethodPrototypeSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::MethodPrototypeSymbol>,_(std::ranges::subrange_kind)0>
                 *)&stack0xfffffffffffffe50);
        std::ranges::
        subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::MethodPrototypeSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::MethodPrototypeSymbol>,_(std::ranges::subrange_kind)0>
        ::end((subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::MethodPrototypeSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::MethodPrototypeSymbol>,_(std::ranges::subrange_kind)0>
               *)&stack0xfffffffffffffe50);
        while (bVar1 = operator==<slang::ast::Scope::specific_symbol_iterator<slang::ast::MethodPrototypeSymbol>_>
                                 ((self_type *)in_stack_fffffffffffffde0,
                                  (specific_symbol_iterator<slang::ast::MethodPrototypeSymbol> *)
                                  in_stack_fffffffffffffdd8), ((bVar1 ^ 0xffU) & 1) != 0) {
          local_1c8 = iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::MethodPrototypeSymbol>,_false>
                      ::operator*((iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::MethodPrototypeSymbol>,_false>
                                   *)0x801e3a);
          bitmask<slang::ast::MethodFlags>::bitmask(&local_1ca,ModportExport);
          bVar1 = bitmask<slang::ast::MethodFlags>::has
                            ((bitmask<slang::ast::MethodFlags> *)in_stack_fffffffffffffde0,
                             (bitmask<slang::ast::MethodFlags> *)in_stack_fffffffffffffdd8);
          if (bVar1) {
            this_00 = (SmallVectorBase<std::pair<const_slang::ast::InterfacePortSymbol_*,_const_slang::ast::ModportSymbol_*>_>
                       *)(in_RDI + 0x168);
            local_1e8 = local_148;
            std::pair<const_slang::ast::InterfacePortSymbol_*,_const_slang::ast::ModportSymbol_*>::
            pair<const_slang::ast::InterfacePortSymbol_*,_const_slang::ast::ModportSymbol_*&,_true>
                      (&local_1e0,&local_1e8,__y_00);
            SmallVectorBase<std::pair<const_slang::ast::InterfacePortSymbol_*,_const_slang::ast::ModportSymbol_*>_>
            ::push_back(this_00,in_stack_fffffffffffffdd8);
            return;
          }
          iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::MethodPrototypeSymbol>,_false>
          ::
          operator++<slang::ast::Scope::specific_symbol_iterator<slang::ast::MethodPrototypeSymbol>_>
                    ((iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::MethodPrototypeSymbol>,_false>
                      *)in_stack_fffffffffffffde0);
        }
      }
    }
  }
  return;
}

Assistant:

void handle(const InterfacePortSymbol& symbol) {
        if (!handleDefault(symbol))
            return;
        symbol.getDeclaredRange();

        if (symbol.interfaceDef) {
            usedIfacePorts.emplace(symbol.interfaceDef);

            // If this interface port specifies a modport and that
            // modport has export methods, store it in a list for later
            // processing and checking.
            if (!symbol.modport.empty()) {
                auto [_, modport] = symbol.getConnection();
                if (modport) {
                    for (auto& method : modport->membersOfType<MethodPrototypeSymbol>()) {
                        if (method.flags.has(MethodFlags::ModportExport)) {
                            modportsWithExports.push_back({&symbol, modport});
                            break;
                        }
                    }
                }
            }
        }
    }